

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::PrimitiveTopologyTest::createBufferData
          (PrimitiveTopologyTest *this,VkPrimitiveTopology topology,int primitiveCount,
          VkIndexType indexType,vector<unsigned_int,_std::allocator<unsigned_int>_> *indexData,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          *vertexData)

{
  undefined4 uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int vertexNdx_3;
  int vertexNdx_2;
  int vertexNdx;
  int iVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  uint local_12c;
  value_type local_128;
  ulong local_108;
  ulong local_100;
  undefined1 local_f8 [16];
  Vector<float,_4> local_e8;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  value_type local_68;
  Vector<float,_4> local_48;
  
  local_e8.m_data[0] = 1.0;
  local_e8.m_data[1] = 0.0;
  local_e8.m_data[2] = 0.0;
  local_e8.m_data[3] = 1.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  local_68.position.m_data[0] = -1.0;
  local_68.position.m_data[1] = -1.0;
  local_68.position.m_data[2] = 0.0;
  local_68.position.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_68.color,&local_48);
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(topology) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
    local_f8._0_4_ = 1.6 / (float)(primitiveCount / -2 + primitiveCount + -1);
    uVar4 = 0;
    if (primitiveCount < 1) {
      primitiveCount = 0;
    }
    for (; primitiveCount != uVar4; uVar4 = uVar4 + 1) {
      local_128.position.m_data[0] = (float)(uVar4 >> 1) * (float)local_f8._0_4_ + -0.8;
      local_128.position.m_data[1] = (float)(uVar4 & 1) * 1.6 + -0.8;
      local_128.position.m_data[2] = 0.0;
      local_128.position.m_data[3] = 1.0;
      tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
      std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
      push_back(&vertices,&local_128);
      local_12c = uVar4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&indices,&local_12c);
    }
    goto switchD_00522c4a_default;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
    iVar2 = primitiveCount + -1;
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    iVar2 = primitiveCount / 2;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
    iVar2 = primitiveCount / 2 + primitiveCount + primitiveCount % 2 + -1;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
    iVar2 = primitiveCount / -2 + primitiveCount;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    local_f8._0_12_ = ZEXT812(0x3f4ccccd);
    local_f8._12_4_ = 0;
    local_108 = CONCAT44(local_108._4_4_,0x3f4ccccd);
    goto LAB_00522e0c;
  default:
    local_f8 = ZEXT816(0);
    goto LAB_00522c31;
  }
  local_f8 = ZEXT416((uint)(1.6 / (float)iVar2));
LAB_00522c31:
  uVar1 = local_f8._0_4_;
  switch(topology) {
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
    uVar3 = 0;
    local_100 = (ulong)(uint)primitiveCount;
    if (primitiveCount < 1) {
      local_100 = uVar3;
    }
    iVar2 = 0;
    while ((float)iVar2 != (float)local_100) {
      local_108 = CONCAT44(local_108._4_4_,iVar2);
      for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
        uVar4 = (int)uVar3 + iVar2;
        local_128.position.m_data[0] = (float)((int)uVar4 / 2) * (float)local_f8._0_4_ + -0.8;
        local_128.position.m_data[1] = (float)iVar2 * 1.6 + -0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = uVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
      }
      uVar3 = (ulong)((int)uVar3 + 2);
      iVar2 = (int)(float)local_108 + 1;
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
    iVar2 = 0;
    if (0 < primitiveCount) {
      iVar2 = primitiveCount;
    }
    uVar3 = 1;
    while (uVar4 = (uint)uVar3, uVar4 - iVar2 != 1) {
      if (uVar4 == 1) {
        local_128.position.m_data[0] = -0.8;
        local_128.position.m_data[1] = -0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
        local_128.position.m_data[0] = -0.8;
        local_128.position.m_data[1] = 0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
      }
      else {
        local_128.position.m_data[0] = (float)(int)(uVar3 >> 1) * (float)local_f8._0_4_ + -0.8;
        local_128.position.m_data[1] = (float)(uVar4 & 1) * 1.6 + -0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = uVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
      }
      uVar3 = (ulong)(uVar4 + 1);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    uVar3 = 0;
    local_100 = (ulong)(uint)primitiveCount;
    if (primitiveCount < 1) {
      local_100 = uVar3;
    }
    local_f8._4_4_ = 0x3fcccccd;
    local_f8._8_8_ = 0;
    iVar2 = 0;
    while ((float)iVar2 != (float)local_100) {
      local_108 = CONCAT44(local_108._4_4_,iVar2);
      for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
        uVar4 = (int)uVar3 + iVar2;
        local_128.position.m_data[0] = (float)((int)uVar4 / 2) * (float)local_f8._0_4_ + -0.8;
        local_128.position.m_data[1] = (float)((int)uVar4 % 2) * (float)local_f8._4_4_ + -0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = uVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
      }
      uVar3 = (ulong)((int)uVar3 + 3);
      iVar2 = (int)(float)local_108 + 1;
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
    uVar3 = 0;
    local_100 = (ulong)(uint)primitiveCount;
    if (primitiveCount < 1) {
      local_100 = uVar3;
    }
    while( true ) {
      iVar2 = (int)uVar3;
      if ((float)iVar2 == (float)local_100) break;
      local_108 = uVar3;
      if (iVar2 == 0) {
        uVar3 = 0;
        while (uVar4 = (uint)uVar3, uVar4 != 3) {
          local_128.position.m_data[0] = (float)(int)(uVar3 >> 1) * (float)local_f8._0_4_ + -0.8;
          local_128.position.m_data[1] = (float)(uVar4 & 1) * 1.6 + -0.8;
          local_128.position.m_data[2] = 0.0;
          local_128.position.m_data[3] = 1.0;
          tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&vertices,&local_128);
          local_12c = uVar4;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&indices,&local_12c);
          uVar3 = (ulong)(uVar4 + 1);
        }
      }
      else {
        uVar4 = iVar2 + 2;
        local_128.position.m_data[0] = (float)((int)uVar4 / 2) * (float)uVar1 + -0.8;
        local_128.position.m_data[1] = (float)((int)uVar4 % 2) * 1.6 + -0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = uVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
      }
      uVar3 = (ulong)((int)local_108 + 1);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    local_108 = CONCAT44(local_108._4_4_,0x3fcccccd);
LAB_00522e0c:
    fVar8 = 1.5707964;
    if (6.2831855 / (float)primitiveCount <= 1.5707964) {
      fVar8 = 6.2831855 / (float)primitiveCount;
    }
    local_100 = CONCAT44(local_100._4_4_,fVar8);
    iVar2 = 0;
    if (0 < primitiveCount) {
      iVar2 = primitiveCount;
    }
    for (iVar6 = 1; iVar6 - iVar2 != 1; iVar6 = iVar6 + 1) {
      if (iVar6 == 1) {
        local_128.position.m_data[0] = 0.0;
        local_128.position.m_data[1] = 0.0;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
        local_128.position.m_data[0] = (float)local_f8._0_4_;
        local_128.position.m_data[1] = 0.0;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
        fVar8 = cosf((float)local_100);
        local_128.position.m_data[1] = sinf((float)local_100);
        local_128.position.m_data[0] = fVar8 * (float)local_f8._0_4_;
        local_128.position.m_data[1] = local_128.position.m_data[1] * (float)local_108;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
      }
      else {
        fVar8 = (float)iVar6 * (float)local_100;
        fVar9 = cosf(fVar8);
        local_128.position.m_data[1] = sinf(fVar8);
        local_128.position.m_data[0] = fVar9 * (float)local_f8._0_4_;
        local_128.position.m_data[1] = local_128.position.m_data[1] * (float)local_108;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = iVar6 + 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
      }
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&vertices,&local_68);
    uVar4 = 0;
    if (primitiveCount < 1) {
      primitiveCount = uVar4;
    }
    local_100 = (ulong)(uint)primitiveCount;
    iVar2 = 0;
    while ((float)iVar2 != (float)local_100) {
      local_108 = CONCAT44(local_108._4_4_,iVar2);
      local_128.position.m_data[0] = 0.0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&indices,(uint *)&local_128);
      for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
        local_128.position.m_data[0] =
             (float)((int)(uVar4 + iVar2) / 2) * (float)local_f8._0_4_ + -0.8;
        local_128.position.m_data[1] = (float)iVar2 * 1.6 + -0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = uVar4 + iVar2 + 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
      }
      local_128.position.m_data[0] = 0.0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&indices,(uint *)&local_128);
      uVar4 = uVar4 + 2;
      iVar2 = (int)(float)local_108 + 1;
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&vertices,&local_68);
    local_128.position.m_data[0] = 0.0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&indices,(uint *)&local_128);
    iVar2 = 0;
    if (0 < primitiveCount) {
      iVar2 = primitiveCount;
    }
    uVar3 = 1;
    while (uVar4 = (uint)uVar3, uVar4 - iVar2 != 1) {
      if (uVar4 == 1) {
        local_128.position.m_data[0] = -0.8;
        local_128.position.m_data[1] = -0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
        local_128.position.m_data[0] = -0.8;
        local_128.position.m_data[1] = 0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
      }
      else {
        local_128.position.m_data[0] = (float)(int)(uVar3 >> 1) * (float)local_f8._0_4_ + -0.8;
        local_128.position.m_data[1] = (float)(uVar4 & 1) * 1.6 + -0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = uVar4 + 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
      }
      uVar3 = (ulong)(uVar4 + 1);
    }
    local_128.position.m_data[0] = 0.0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&indices,(uint *)&local_128);
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&vertices,&local_68);
    iVar2 = 0;
    if (primitiveCount < 1) {
      primitiveCount = 0;
    }
    local_100 = (ulong)(uint)primitiveCount;
    local_f8._4_4_ = 0x3fcccccd;
    local_f8._8_8_ = 0;
    uVar4 = 1;
    while ((float)iVar2 != (float)local_100) {
      local_108 = CONCAT44(local_108._4_4_,iVar2);
      iVar2 = 3;
      uVar5 = uVar4;
      while (bVar7 = iVar2 != 0, iVar2 = iVar2 + -1, bVar7) {
        local_128.position.m_data[0] = (float)((int)(uVar5 - 1) / 2) * (float)local_f8._0_4_ + -0.8;
        local_128.position.m_data[1] = (float)((int)(uVar5 - 1) % 2) * (float)local_f8._4_4_ + -0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = uVar5;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
        local_12c = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
        uVar5 = uVar5 + 1;
      }
      uVar4 = uVar4 + 3;
      iVar2 = (int)(float)local_108 + 1;
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&vertices,&local_68);
    uVar3 = 0;
    local_100 = (ulong)(uint)primitiveCount;
    if (primitiveCount < 1) {
      local_100 = uVar3;
    }
    uVar1 = local_f8._0_4_;
    while( true ) {
      iVar2 = (int)uVar3;
      if ((float)iVar2 == (float)local_100) break;
      local_108 = uVar3;
      if (iVar2 == 0) {
        for (uVar4 = 1; uVar4 != 4; uVar4 = uVar4 + 1) {
          local_128.position.m_data[0] = (float)(uVar4 - 1 >> 1) * (float)local_f8._0_4_ + -0.8;
          local_128.position.m_data[1] = (float)(uVar4 - 1 & 1) * 1.6 + -0.8;
          local_128.position.m_data[2] = 0.0;
          local_128.position.m_data[3] = 1.0;
          tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&vertices,&local_128);
          local_12c = uVar4;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&indices,&local_12c);
          local_12c = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&indices,&local_12c);
        }
      }
      else {
        local_128.position.m_data[0] = (float)((iVar2 + 2) / 2) * (float)uVar1 + -0.8;
        local_128.position.m_data[1] = (float)((iVar2 + 2) % 2) * 1.6 + -0.8;
        local_128.position.m_data[2] = 0.0;
        local_128.position.m_data[3] = 1.0;
        tcu::Vector<float,_4>::Vector(&local_128.color,&local_e8);
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&vertices,&local_128);
        local_12c = iVar2 + 3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
        local_12c = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_12c);
      }
      uVar3 = (ulong)((int)local_108 + 1);
    }
  }
switchD_00522c4a_default:
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
            (vertexData,&vertices);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(indexData,&indices);
  std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  ~_Vector_base(&vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void PrimitiveTopologyTest::createBufferData (VkPrimitiveTopology topology, int primitiveCount, VkIndexType indexType, std::vector<deUint32>& indexData, std::vector<Vertex4RGBA>& vertexData) const
{
	DE_ASSERT(primitiveCount > 0);
	DE_UNREF(indexType);

	const tcu::Vec4				red						(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4				green					(0.0f, 1.0f, 0.0f, 1.0f);
	const float					border					= 0.2f;
	const float					originX					= -1.0f + border;
	const float					originY					= -1.0f + border;
	const Vertex4RGBA			defaultVertex			= { tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), green };
	float						primitiveSizeY			= (2.0f - 2.0f * border);
	float						primitiveSizeX;
	std::vector<deUint32>		indices;
	std::vector<Vertex4RGBA>	vertices;


	// Calculate primitive size
	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2 - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount + primitiveCount / 2 + primitiveCount % 2 - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
			primitiveSizeX = 1.0f - border;
			primitiveSizeY = 1.0f - border;
			break;

		default:
			primitiveSizeX = 0.0f; // Garbage
			DE_ASSERT(false);
	}

	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				const Vertex4RGBA vertex =
				{
					tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
					red
				};

				vertices.push_back(vertex);
				indices.push_back(primitiveNdx);
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 2 + vertexNdx) / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((primitiveNdx * 2 + vertexNdx));
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(originX, originY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(0);

					vertex.position = tcu::Vec4(originX, originY + primitiveSizeY, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(1);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 1);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 3 + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx * 3 + vertexNdx)% 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 3 + vertexNdx);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(vertexNdx / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back(vertexNdx);
					}
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		{
			const float stepAngle = de::min(DE_PI * 0.5f, (2 * DE_PI) / float(primitiveCount));

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(0);

					vertex.position = tcu::Vec4(primitiveSizeX, 0.0f, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(1);

					vertex.position = tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle), primitiveSizeY * deFloatSin(stepAngle), 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(2);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx + 1)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx + 1)), 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				indices.push_back(0);

				for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 2 + vertexNdx) / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 2 + vertexNdx + 1);
				}

				indices.push_back(0);
			}
			break;


		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);
			indices.push_back(0);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(originX, originY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(1);

					vertex.position = tcu::Vec4(originX, originY + primitiveSizeY, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(2);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}

			indices.push_back(0);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 3 + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx * 3 + vertexNdx)% 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 3 + vertexNdx + 1);
					indices.push_back(0);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(vertexNdx / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back(vertexNdx + 1);
						indices.push_back(0);
					}
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2 + 1);
					indices.push_back(0);
				}
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	vertexData	= vertices;
	indexData	= indices;
}